

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiID IVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *window_00;
  
  pIVar2 = GImGui;
  window = GImGui->HoveredWindow;
  if (window == (ImGuiWindow *)0x0) {
    return false;
  }
  if ((flags & 4U) == 0) {
    window_00 = GImGui->CurrentWindow;
    if ((flags & 2U) != 0) {
      window_00 = GetCombinedRootWindow(window_00,(flags & 8U) == 0);
    }
    if ((flags & 1U) == 0) {
      if (window != window_00) {
        return false;
      }
    }
    else {
      bVar3 = IsWindowChildOf(window,window_00,(flags & 8U) == 0);
      if (!bVar3) {
        return false;
      }
    }
  }
  bVar3 = IsWindowContentHoverable(window,flags);
  if ((bVar3) &&
     (((((char)flags < '\0' || (IVar1 = pIVar2->ActiveId, IVar1 == 0)) ||
       (pIVar2->ActiveIdAllowOverlap != false)) || (IVar1 == window->MoveId)))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.HoveredWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;
    if (ref_window == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        IM_ASSERT(cur_window); // Not inside a Begin()/End()
        const bool popup_hierarchy = (flags & ImGuiHoveredFlags_NoPopupHierarchy) == 0;
        if (flags & ImGuiHoveredFlags_RootWindow)
            cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy);

        bool result;
        if (flags & ImGuiHoveredFlags_ChildWindows)
            result = IsWindowChildOf(ref_window, cur_window, popup_hierarchy);
        else
            result = (ref_window == cur_window);
        if (!result)
            return false;
    }

    if (!IsWindowContentHoverable(ref_window, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != ref_window->MoveId)
            return false;
    return true;
}